

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(BlockedRead *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown_123::AsyncPipe::BlockedRead::write((BlockedRead *)this,in_ESI + -8,in_RDX,in_RCX);
  return;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      KJ_SWITCH_ONEOF(writeImpl(pieces[0], pieces.slice(1, pieces.size()))) {
        KJ_CASE_ONEOF(done, Done) {
          return READY_NOW;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          if (retry.data.size() == 0) {
            // We exactly finished the current piece, so just issue a write for the remaining
            // pieces.
            if (retry.moreData.size() == 0) {
              // Nothing left.
              return READY_NOW;
            } else {
              // Write remaining pieces.
              return pipe.write(retry.moreData);
            }
          } else {
            // Unfortunately we have to execute a separate write() for the remaining part of this
            // piece, because we can't modify the pieces array.
            auto promise = pipe.write(retry.data);
            if (retry.moreData.size() == 0) {
              // No more pieces so that's it.
              return kj::mv(promise);
            } else {
              // Also need to write the remaining pieces.
              auto& pipeRef = pipe;
              return promise.then([pieces=retry.moreData,&pipeRef]() {
                return pipeRef.write(pieces);
              });
            }
          }
        }
      }
      KJ_UNREACHABLE;
    }